

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessTexturesTests.cpp
# Opt level: O3

bool __thiscall
gl4cts::DirectStateAccess::Textures::SubImageErrorsTest::Test1DCompressed(SubImageErrorsTest *this)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  deUint32 dVar6;
  undefined4 extraout_var;
  ErrorsUtilities *pEVar8;
  long lVar7;
  
  iVar5 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar7 = CONCAT44(extraout_var,iVar5);
  if (this->m_reference_compressed_1D == (GLubyte *)0x0) {
    bVar1 = true;
  }
  else {
    pEVar8 = (ErrorsUtilities *)(ulong)this->m_to_invalid;
    (**(code **)(lVar7 + 0x2d8))
              (pEVar8,0,0,4,this->m_reference_compressed_1D_format,
               this->m_reference_compressed_1D_size,this->m_reference_compressed_1D);
    bVar1 = ErrorsUtilities::CheckErrorAndLog
                      (pEVar8,(this->super_TestCase).m_context,0x502,"glCompressedTextureSubImage1D"
                       ,"texture is not the name of an existing texture object.");
    pEVar8 = (ErrorsUtilities *)(ulong)this->m_to_1D_compressed;
    (**(code **)(lVar7 + 0x2d8))
              (pEVar8,0,0,4,0x8dbd,this->m_reference_compressed_1D_size,
               this->m_reference_compressed_1D);
    bVar2 = ErrorsUtilities::CheckErrorAndLog
                      (pEVar8,(this->super_TestCase).m_context,0x500,"glCompressedTextureSubImage1D"
                       ,
                       "internalformat is of the generic compressed internal formats: COMPRESSED_RED, COMPRESSED_RG, COMPRESSED_RGB, COMPRESSED_RGBA. COMPRESSED_SRGB, or COMPRESSED_SRGB_ALPHA."
                      );
    pEVar8 = (ErrorsUtilities *)(ulong)this->m_to_1D_compressed;
    (**(code **)(lVar7 + 0x2d8))
              (pEVar8,0,0,4,this->m_format_compressed_not_matching,
               this->m_reference_compressed_1D_size,this->m_reference_compressed_1D);
    bVar3 = ErrorsUtilities::CheckErrorAndLog
                      (pEVar8,(this->super_TestCase).m_context,0x502,"glCompressedTextureSubImage1D"
                       ,
                       "format does not match the internal format of the texture image being modified, since these commands do not provide for image format conversion."
                      );
    pEVar8 = (ErrorsUtilities *)(ulong)this->m_to_1D_compressed;
    (**(code **)(lVar7 + 0x2d8))
              (pEVar8,0,0,4,this->m_reference_compressed_1D_format,
               this->m_reference_compressed_1D_size + -1,this->m_reference_compressed_1D);
    bVar4 = ErrorsUtilities::CheckErrorAndLog
                      (pEVar8,(this->super_TestCase).m_context,0x501,"glCompressedTextureSubImage1D"
                       ,
                       "imageSize is not consistent with the format, dimensions, and contents of the specified compressed image data."
                      );
    bVar2 = (bVar4 && bVar3) && (bVar2 && bVar1);
    (**(code **)(lVar7 + 0x40))(0x88ec,this->m_bo);
    dVar6 = (**(code **)(lVar7 + 0x800))();
    glu::checkError(dVar6,"glBindBuffer has failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                    ,0x2816);
    (**(code **)(lVar7 + 0xcf8))(0x88ec,0x88ba);
    iVar5 = (**(code **)(lVar7 + 0x800))();
    if (iVar5 == 0) {
      pEVar8 = (ErrorsUtilities *)(ulong)this->m_to_1D_compressed;
      (**(code **)(lVar7 + 0x2d8))
                (pEVar8,0,0,4,this->m_reference_compressed_1D_format,
                 this->m_reference_compressed_1D_size,0);
      bVar1 = ErrorsUtilities::CheckErrorAndLog
                        (pEVar8,(this->super_TestCase).m_context,0x502,
                         "glCompressedTextureSubImage1D",
                         "a non-zero buffer object name is bound to the PIXEL_UNPACK_BUFFER target and the buffer object\'s data store is currently mapped."
                        );
      bVar2 = bVar2 && bVar1;
      (**(code **)(lVar7 + 0x1670))(0x88ec);
      dVar6 = (**(code **)(lVar7 + 0x800))();
      glu::checkError(dVar6,"glBindBuffer has failed",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                      ,0x2823);
      (**(code **)(lVar7 + 0x40))(0x88ec,0);
      dVar6 = (**(code **)(lVar7 + 0x800))();
      glu::checkError(dVar6,"glBindBuffer has failed",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                      ,0x2826);
    }
    (**(code **)(lVar7 + 0x40))(0x88ec,this->m_bo);
    dVar6 = (**(code **)(lVar7 + 0x800))();
    glu::checkError(dVar6,"glBindBuffer has failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                    ,0x2830);
    pEVar8 = (ErrorsUtilities *)(ulong)this->m_to_1D_compressed;
    (**(code **)(lVar7 + 0x2d8))
              (pEVar8,0,0,4,this->m_reference_compressed_1D_format,
               this->m_reference_compressed_1D_size,0x400);
    bVar1 = ErrorsUtilities::CheckErrorAndLog
                      (pEVar8,(this->super_TestCase).m_context,0x502,"glCompressedTextureSubImage1D"
                       ,
                       "a non-zero buffer object name is bound to the PIXEL_UNPACK_BUFFER target and the buffer object\'s data store is currently mapped."
                      );
    bVar1 = (bool)(bVar1 & bVar2);
    (**(code **)(lVar7 + 0x40))(0x88ec,0);
    dVar6 = (**(code **)(lVar7 + 0x800))();
    glu::checkError(dVar6,"glBindBuffer has failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                    ,0x283a);
  }
  return bVar1;
}

Assistant:

bool SubImageErrorsTest::Test1DCompressed()
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Result. */
	bool is_ok = true;

	/* Do tests only if compressed 1D textures are supported. */
	if (DE_NULL != m_reference_compressed_1D)
	{
		/* Check that INVALID_OPERATION is generated by CompressedTextureSubImage1D
		 if texture is not the name of an existing texture object. */
		{
			gl.compressedTextureSubImage1D(m_to_invalid, 0, 0, s_reference_width, m_reference_compressed_1D_format,
										   m_reference_compressed_1D_size, m_reference_compressed_1D);
			is_ok &= CheckErrorAndLog(m_context, GL_INVALID_OPERATION, "glCompressedTextureSubImage1D",
									  "texture is not the name of an existing texture object.");
		}

		/* Check that INVALID_ENUM is generated by CompressedTextureSubImage1D if
		 internalformat is not one of the generic compressed internal formats:
		 COMPRESSED_RED, COMPRESSED_RG, COMPRESSED_RGB, COMPRESSED_RGBA.
		 COMPRESSED_SRGB, or COMPRESSED_SRGB_ALPHA. */
		{
			/* GL_COMPRESSED_RG_RGTC2 is not 1D as specification says. */
			gl.compressedTextureSubImage1D(m_to_1D_compressed, 0, 0, s_reference_width, GL_COMPRESSED_RG_RGTC2,
										   m_reference_compressed_1D_size, m_reference_compressed_1D);
			is_ok &= CheckErrorAndLog(m_context, GL_INVALID_ENUM, "glCompressedTextureSubImage1D",
									  "internalformat is of the generic compressed internal formats: COMPRESSED_RED, "
									  "COMPRESSED_RG, COMPRESSED_RGB, COMPRESSED_RGBA. COMPRESSED_SRGB, or "
									  "COMPRESSED_SRGB_ALPHA.");
		}

		/* Check that INVALID_OPERATION is generated if format does not match the
		 internal format of the texture image being modified, since these
		 commands do not provide for image format conversion. */
		{
			gl.compressedTextureSubImage1D(m_to_1D_compressed, 0, 0, s_reference_width,
										   m_format_compressed_not_matching, m_reference_compressed_1D_size,
										   m_reference_compressed_1D);
			is_ok &= CheckErrorAndLog(m_context, GL_INVALID_OPERATION, "glCompressedTextureSubImage1D",
									  "format does not match the internal format of the texture image being modified, "
									  "since these commands do not provide for image format conversion.");
		}

		/* Check that INVALID_VALUE is generated by CompressedTextureSubImage1D if
		 imageSize is not consistent with the format, dimensions, and contents of
		 the specified compressed image data. */
		{
			gl.compressedTextureSubImage1D(m_to_1D_compressed, 0, 0, s_reference_width,
										   m_reference_compressed_1D_format, m_reference_compressed_1D_size - 1,
										   m_reference_compressed_1D);
			is_ok &= CheckErrorAndLog(m_context, GL_INVALID_VALUE, "glCompressedTextureSubImage1D",
									  "imageSize is not consistent with the format, dimensions, and contents of the "
									  "specified compressed image data.");
		}

		/* Check that INVALID_OPERATION is generated by CompressedTextureSubImage1D
		 if a non-zero buffer object name is bound to the PIXEL_UNPACK_BUFFER
		 target and the buffer object's data store is currently mapped. */
		{
			gl.bindBuffer(GL_PIXEL_UNPACK_BUFFER, m_bo);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBuffer has failed");

			gl.mapBuffer(GL_PIXEL_UNPACK_BUFFER, GL_READ_WRITE);

			if (GL_NO_ERROR == gl.getError())
			{
				gl.compressedTextureSubImage1D(m_to_1D_compressed, 0, 0, s_reference_width,
											   m_reference_compressed_1D_format, m_reference_compressed_1D_size, NULL);
				is_ok &= CheckErrorAndLog(m_context, GL_INVALID_OPERATION, "glCompressedTextureSubImage1D",
										  "a non-zero buffer object name is bound to the PIXEL_UNPACK_BUFFER target "
										  "and the buffer object's data store is currently mapped.");

				gl.unmapBuffer(GL_PIXEL_UNPACK_BUFFER);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBuffer has failed");

				gl.bindBuffer(GL_PIXEL_UNPACK_BUFFER, 0);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBuffer has failed");
			}
		}

		/* Check that INVALID_OPERATION is generated by CompressedTextureSubImage1D
		 if a non-zero buffer object name is bound to the PIXEL_UNPACK_BUFFER
		 target and the data would be unpacked from the buffer object such that
		 the memory reads required would exceed the data store size. */
		{
			gl.bindBuffer(GL_PIXEL_UNPACK_BUFFER, m_bo);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBuffer has failed");

			gl.compressedTextureSubImage1D(m_to_1D_compressed, 0, 0, s_reference_width,
										   m_reference_compressed_1D_format, m_reference_compressed_1D_size,
										   (glw::GLubyte*)NULL + s_reference_size * 2);
			is_ok &= CheckErrorAndLog(m_context, GL_INVALID_OPERATION, "glCompressedTextureSubImage1D",
									  "a non-zero buffer object name is bound to the PIXEL_UNPACK_BUFFER target and "
									  "the buffer object's data store is currently mapped.");

			gl.bindBuffer(GL_PIXEL_UNPACK_BUFFER, 0);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBuffer has failed");
		}
	}

	return is_ok;
}